

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare::operator()
          (SymbolCompare *this,SymbolEntry *lhs,SymbolEntry *rhs)

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  size_type sVar1;
  size_type sVar2;
  string local_f0;
  string local_d0;
  char *local_b0;
  size_t local_a8;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  int local_6c;
  undefined1 local_68 [4];
  int res;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  rhs_parts;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  lhs_parts;
  SymbolEntry *rhs_local;
  SymbolEntry *lhs_local;
  SymbolCompare *this_local;
  
  GetParts((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
            *)&rhs_parts.second._M_str,this,lhs);
  GetParts((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
            *)local_68,this,rhs);
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_68);
  local_80 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                       ((basic_string_view<char,_std::char_traits<char>_> *)&rhs_parts.second._M_str
                        ,0,sVar1);
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&rhs_parts.second._M_str);
  local_90 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                       ((basic_string_view<char,_std::char_traits<char>_> *)local_68,0,sVar1);
  local_6c = std::basic_string_view<char,_std::char_traits<char>_>::compare(&local_80,local_90);
  if (local_6c == 0) {
    sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&rhs_parts.second._M_str)
    ;
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_68);
    if (sVar1 == sVar2) {
      local_b0 = rhs_parts.first._M_str;
      local_a8 = rhs_parts.second._M_len;
      __x._M_str = (char *)lhs_parts.second._M_len;
      __x._M_len = (size_t)lhs_parts.first._M_str;
      __y._M_str = (char *)rhs_parts.second._M_len;
      __y._M_len = (size_t)rhs_parts.first._M_str;
      this_local._7_1_ = std::operator<(__x,__y);
    }
    else {
      AsString_abi_cxx11_(&local_d0,this,lhs);
      AsString_abi_cxx11_(&local_f0,this,rhs);
      this_local._7_1_ = std::operator<(&local_d0,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_d0);
    }
  }
  else {
    this_local._7_1_ = local_6c < 0;
  }
  return this_local._7_1_;
}

Assistant:

bool operator()(const SymbolEntry& lhs, const SymbolEntry& rhs) const {
      auto lhs_parts = GetParts(lhs);
      auto rhs_parts = GetParts(rhs);

      // Fast path to avoid making the whole string for common cases.
      if (int res =
              lhs_parts.first.substr(0, rhs_parts.first.size())
                  .compare(rhs_parts.first.substr(0, lhs_parts.first.size()))) {
        // If the packages already differ, exit early.
        return res < 0;
      } else if (lhs_parts.first.size() == rhs_parts.first.size()) {
        return lhs_parts.second < rhs_parts.second;
      }
      return AsString(lhs) < AsString(rhs);
    }